

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetMAA(void *kinmem,long maa)

{
  KINMem kin_mem;
  long maa_local;
  void *kinmem_local;
  
  if (kinmem == (void *)0x0) {
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINSetMAA","kinsol_mem = NULL illegal.");
    kinmem_local._4_4_ = -1;
  }
  else if (maa < 0) {
    KINProcessError((KINMem)0x0,-2,"KINSOL","KINSetMAA","maa < 0 illegal.");
    kinmem_local._4_4_ = -2;
  }
  else {
    kin_mem = (KINMem)maa;
    if (*(long *)((long)kinmem + 0x30) < maa) {
      kin_mem = *(KINMem *)((long)kinmem + 0x30);
    }
    *(KINMem *)((long)kinmem + 400) = kin_mem;
    *(uint *)((long)kinmem + 0x198) = (uint)(kin_mem != (KINMem)0x0);
    kinmem_local._4_4_ = 0;
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINSetMAA(void *kinmem, long int maa)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetMAA", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;

  if (maa < 0) {
    KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetMAA", MSG_BAD_MAA);
    return(KIN_ILL_INPUT);
  }

  if (maa > kin_mem->kin_mxiter) maa = kin_mem->kin_mxiter;

  kin_mem = (KINMem) kinmem;
  kin_mem->kin_m_aa = maa;
  kin_mem->kin_aamem_aa = (maa == 0) ? SUNFALSE : SUNTRUE;

  return(KIN_SUCCESS);
}